

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int finishbinexpneg(FuncState *fs,expdesc *e1,expdesc *e2,OpCode op,int line,TMS event)

{
  int iVar1;
  
  iVar1 = 0;
  if (((e2->k == VKINT) && (iVar1 = 0, e2->t == e2->f)) &&
     (0xffffffffffffff00 < (e2->u).ival - 0x80U)) {
    iVar1 = (int)(e2->u).ival;
    finishbinexpval(fs,e1,e2,op,0x7f - iVar1,0,line,OP_MMBINI,event);
    *(char *)((long)fs->f->code + (long)fs->pc * 4 + -2) =
         (char)((uint)(iVar1 * 0x10000 + 0x7f0000) >> 0x10);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int finishbinexpneg (FuncState *fs, expdesc *e1, expdesc *e2,
                             OpCode op, int line, TMS event) {
  if (!luaK_isKint(e2))
    return 0;  /* not an integer constant */
  else {
    lua_Integer i2 = e2->u.ival;
    if (!(fitsC(i2) && fitsC(-i2)))
      return 0;  /* not in the proper range */
    else {  /* operating a small integer constant */
      int v2 = cast_int(i2);
      finishbinexpval(fs, e1, e2, op, int2sC(-v2), 0, line, OP_MMBINI, event);
      /* correct metamethod argument */
      SETARG_B(fs->f->code[fs->pc - 1], int2sC(v2));
      return 1;  /* successfully coded */
    }
  }
}